

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expressions.cpp
# Opt level: O2

unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> __thiscall
IRT::CEseqExpression::Copy(CEseqExpression *this)

{
  _func_int **pp_Var1;
  pointer *__ptr;
  long in_RSI;
  _func_int *local_28;
  _func_int *local_20;
  
  pp_Var1 = (_func_int **)operator_new(0x18);
  (**(code **)(**(long **)(in_RSI + 8) + 0x18))(&local_28);
  (**(code **)(**(long **)(in_RSI + 0x10) + 0x18))(&local_20);
  *pp_Var1 = (_func_int *)&PTR_Accept_0017b200;
  pp_Var1[1] = local_28;
  pp_Var1[2] = local_20;
  (this->super_CExpression).super_IExpression.super_INode._vptr_INode = pp_Var1;
  return (__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const IRT::CExpression> IRT::CEseqExpression::Copy( ) const {
    return std::move(
            std::unique_ptr<const IRT::CExpression>( new CEseqExpression( statement->Copy( ), expression->Copy( ))));
}